

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.c
# Opt level: O0

void prf_state_reset(prf_state_t *state)

{
  undefined4 *puVar1;
  undefined8 *in_RDI;
  matrix4x4_f32_t *m;
  int in_stack_ffffffffffffffec;
  void *in_stack_fffffffffffffff0;
  
  *in_RDI = 0;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  in_RDI[4] = 0;
  in_RDI[5] = 0;
  *(undefined2 *)((long)in_RDI + 0x74) = 0;
  *(undefined4 *)(in_RDI + 0xe) = 0;
  prf_array_set_count(in_stack_fffffffffffffff0,in_stack_ffffffffffffffec);
  prf_array_set_count(in_stack_fffffffffffffff0,in_stack_ffffffffffffffec);
  prf_array_set_count(in_stack_fffffffffffffff0,in_stack_ffffffffffffffec);
  puVar1 = *(undefined4 **)in_RDI[9];
  *puVar1 = 0x3f800000;
  puVar1[1] = 0;
  puVar1[2] = 0;
  puVar1[3] = 0;
  puVar1[4] = 0;
  puVar1[5] = 0x3f800000;
  puVar1[6] = 0;
  puVar1[7] = 0;
  puVar1[8] = 0;
  puVar1[9] = 0;
  puVar1[10] = 0x3f800000;
  puVar1[0xb] = 0;
  puVar1[0xc] = 0;
  puVar1[0xd] = 0;
  puVar1[0xe] = 0;
  puVar1[0xf] = 0x3f800000;
  *(undefined4 *)(in_RDI + 0xb) = 1;
  *(undefined2 *)((long)in_RDI + 0x76) = 0;
  *(undefined2 *)(in_RDI + 0xf) = 0;
  *(undefined2 *)((long)in_RDI + 0x7a) = 0;
  *(undefined2 *)((long)in_RDI + 0x7c) = 0;
  *(undefined2 *)((long)in_RDI + 0x7e) = 0;
  *(undefined2 *)(in_RDI + 0x10) = 0;
  return;
}

Assistant:

void
prf_state_reset(
    prf_state_t * state )
{
    matrix4x4_f32_t * m;
    state->model = NULL;
    state->node = NULL;

    state->header = 0;
    state->vertex_palette = NULL;
    state->color_palette = NULL;
    state->material_palette = NULL;
    state->object_transparency = 0;
    state->object_flags = 0;
    prf_array_set_count( state->materials, 0 );
    prf_array_set_count( state->textures, 0 );
    prf_array_set_count( state->instances, 0 );
    m = state->matrix[0];
    (*m)[0][0]=1.0f; (*m)[0][1]=0.0f; (*m)[0][2]=0.0f; (*m)[0][3]=0.0f;
    (*m)[1][0]=0.0f; (*m)[1][1]=1.0f; (*m)[1][2]=0.0f; (*m)[1][3]=0.0f;
    (*m)[2][0]=0.0f; (*m)[2][1]=0.0f; (*m)[2][2]=1.0f; (*m)[2][3]=0.0f;
    (*m)[3][0]=0.0f; (*m)[3][1]=0.0f; (*m)[3][2]=0.0f; (*m)[3][3]=1.0f;
    state->inv_dirty = TRUE;

    state->push_level = 0;
    state->subface_level = 0;
    state->attribute_level = 0;
    state->extension_level = 0;

    state->state_push_level = 0;
    state->physical_level = 0;
}